

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_nav2D.cpp
# Opt level: O2

void __thiscall
EnvironmentNAV2D::GetSuccs
          (EnvironmentNAV2D *this,int SourceStateID,vector<int,_std::allocator<int>_> *SuccIDV,
          vector<int,_std::allocator<int>_> *CostV)

{
  pointer piVar1;
  ENVHASHENTRY *pEVar2;
  uchar **ppuVar3;
  bool bVar4;
  int iVar5;
  value_type_conflict1 *__x;
  undefined4 extraout_var_00;
  uchar *puVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int cost;
  int local_44;
  vector<int,_std::allocator<int>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  undefined4 extraout_var;
  
  piVar1 = (SuccIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((SuccIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (SuccIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  piVar1 = (CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  local_40 = SuccIDV;
  std::vector<int,_std::allocator<int>_>::reserve(SuccIDV,(long)(this->EnvNAV2DCfg).numofdirs);
  local_38 = CostV;
  std::vector<int,_std::allocator<int>_>::reserve(CostV,(long)(this->EnvNAV2DCfg).numofdirs);
  if ((this->EnvNAV2D).goalstateid != SourceStateID) {
    pEVar2 = (this->EnvNAV2D).StateID2CoordTable.
             super__Vector_base<ENVHASHENTRY_*,_std::allocator<ENVHASHENTRY_*>_>._M_impl.
             super__Vector_impl_data._M_start[SourceStateID];
    if ((((pEVar2->X < 2) || ((this->EnvNAV2DCfg).EnvWidth_c + -2 <= pEVar2->X)) || (pEVar2->Y < 2))
       || ((this->EnvNAV2DCfg).EnvHeight_c + -2 <= pEVar2->Y)) {
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
    for (uVar12 = 0; (long)uVar12 < (long)(this->EnvNAV2DCfg).numofdirs; uVar12 = uVar12 + 1) {
      iVar5 = pEVar2->X;
      uVar11 = (long)(this->EnvNAV2DCfg).dx_[uVar12] + (long)iVar5;
      uVar7 = (long)(this->EnvNAV2DCfg).dy_[uVar12] + (long)pEVar2->Y;
      if (bVar4) {
        iVar5 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x37])
                          (this,uVar11 & 0xffffffff,uVar7 & 0xffffffff);
        if ((char)iVar5 != '\0') {
          iVar5 = pEVar2->X;
          goto LAB_00128efe;
        }
      }
      else {
LAB_00128efe:
        ppuVar3 = (this->EnvNAV2DCfg).Grid2D;
        puVar6 = ppuVar3[uVar11];
        bVar8 = puVar6[uVar7];
        if ((((int)uVar11 == iVar5) || (7 < uVar12)) || (iVar10 = pEVar2->Y, (int)uVar7 == iVar10))
        {
          if (7 < uVar12) {
            bVar9 = ppuVar3[(long)(this->EnvNAV2DCfg).dxintersects_[uVar12][0] + (long)iVar5]
                    [(long)(this->EnvNAV2DCfg).dyintersects_[uVar12][0] + (long)pEVar2->Y];
            if (ppuVar3[(long)(this->EnvNAV2DCfg).dxintersects_[uVar12][0] + (long)iVar5]
                [(long)(this->EnvNAV2DCfg).dyintersects_[uVar12][0] + (long)pEVar2->Y] < bVar8) {
              bVar9 = bVar8;
            }
            puVar6 = ppuVar3[(long)(this->EnvNAV2DCfg).dxintersects_[uVar12][1] + (long)iVar5];
            iVar10 = (this->EnvNAV2DCfg).dyintersects_[uVar12][1] + pEVar2->Y;
            goto LAB_00128f83;
          }
        }
        else {
          bVar9 = ppuVar3[iVar5][uVar7];
          if (ppuVar3[iVar5][uVar7] < bVar8) {
            bVar9 = bVar8;
          }
LAB_00128f83:
          bVar8 = puVar6[iVar10];
          if (puVar6[iVar10] < bVar9) {
            bVar8 = bVar9;
          }
        }
        if (bVar8 < (this->EnvNAV2DCfg).obsthresh) {
          local_44 = (bVar8 + 1) * (this->EnvNAV2DCfg).dxy_distance_mm_[uVar12];
          iVar5 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x33])
                            (this,uVar11 & 0xffffffff,uVar7 & 0xffffffff);
          __x = (value_type_conflict1 *)CONCAT44(extraout_var,iVar5);
          if (__x == (value_type_conflict1 *)0x0) {
            iVar5 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x34])
                              (this,uVar11 & 0xffffffff,uVar7 & 0xffffffff);
            __x = (value_type_conflict1 *)CONCAT44(extraout_var_00,iVar5);
          }
          std::vector<int,_std::allocator<int>_>::push_back(local_40,__x);
          std::vector<int,_std::allocator<int>_>::push_back(local_38,&local_44);
        }
      }
    }
  }
  return;
}

Assistant:

void EnvironmentNAV2D::GetSuccs(int SourceStateID, vector<int>* SuccIDV, vector<int>* CostV)
{
    int aind;

#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    //clear the successor array
    SuccIDV->clear();
    CostV->clear();
    SuccIDV->reserve(EnvNAV2DCfg.numofdirs);
    CostV->reserve(EnvNAV2DCfg.numofdirs);

    //goal state should be absorbing
    if (SourceStateID == EnvNAV2D.goalstateid) return;

    //get X, Y for the state
    EnvNAV2DHashEntry_t* HashEntry = EnvNAV2D.StateID2CoordTable[SourceStateID];

    //iterate through actions
    bool bTestBounds = false;
    if (HashEntry->X <= 1 || HashEntry->X >= EnvNAV2DCfg.EnvWidth_c - 2 || HashEntry->Y <= 1 ||
        HashEntry->Y >= EnvNAV2DCfg.EnvHeight_c - 2)
    {
        bTestBounds = true;
    }
    for (aind = 0; aind < EnvNAV2DCfg.numofdirs; aind++) {
        int newX = HashEntry->X + EnvNAV2DCfg.dx_[aind];
        int newY = HashEntry->Y + EnvNAV2DCfg.dy_[aind];

        //skip the invalid cells
        if (bTestBounds) {
            if (!IsValidCell(newX, newY)) continue;
        }

        int costmult = EnvNAV2DCfg.Grid2D[newX][newY];

        //for diagonal move, take max over adjacent cells
        if (newX != HashEntry->X && newY != HashEntry->Y && aind <= 7) {
            costmult = __max(costmult, EnvNAV2DCfg.Grid2D[HashEntry->X][newY]);
            costmult = __max(costmult, EnvNAV2DCfg.Grid2D[newX][HashEntry->Y]);
        }
        else if (aind > 7) {
            //check two more cells through which the action goes
            costmult = __max(costmult,
                             EnvNAV2DCfg.Grid2D[HashEntry->X + EnvNAV2DCfg.dxintersects_[aind][0]][HashEntry->Y
                                 + EnvNAV2DCfg.dyintersects_[aind][0]]);
            costmult = __max(costmult,
                             EnvNAV2DCfg.Grid2D[HashEntry->X + EnvNAV2DCfg.dxintersects_[aind][1]][HashEntry->Y
                                 + EnvNAV2DCfg.dyintersects_[aind][1]]);
        }

        //check that it is valid
        if (costmult >= EnvNAV2DCfg.obsthresh) continue;

        //otherwise compute the actual cost
        int cost = (costmult + 1) * EnvNAV2DCfg.dxy_distance_mm_[aind];

        EnvNAV2DHashEntry_t* OutHashEntry;
        if ((OutHashEntry = GetHashEntry(newX, newY)) == NULL) {
            //have to create a new entry
            OutHashEntry = CreateNewHashEntry(newX, newY);
        }

        SuccIDV->push_back(OutHashEntry->stateID);
        CostV->push_back(cost);
    }

#if TIME_DEBUG
    time_getsuccs += clock()-currenttime;
#endif
}